

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  int *piVar1;
  ExprList *pEVar2;
  Expr *pExpr_00;
  Parse *pParse;
  u8 uVar3;
  int iVar4;
  int iVar5;
  FuncDef *pFVar6;
  sqlite3_value **p;
  size_t sVar7;
  sqlite3_value *psVar8;
  sqlite3_value *psVar9;
  void *pvVar10;
  undefined4 uVar11;
  undefined7 in_register_00000011;
  MemValue MVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  sqlite3_value *pVal;
  sqlite3_value *local_98;
  undefined4 local_90;
  uint local_8c;
  ValueNewStat4Ctx *local_88;
  uint local_7c;
  FuncDef *local_78;
  sqlite3_value **local_70;
  sqlite3_context local_68;
  
  local_98 = (sqlite3_value *)0x0;
  for (; (bVar13 = pExpr->op, bVar13 == 0xa6 || (bVar13 == 0xad)); pExpr = pExpr->pLeft) {
  }
  if (bVar13 == 0xa8) {
    bVar13 = pExpr->op2;
  }
  pcVar16 = "";
  lVar14 = 1;
  uVar11 = (undefined4)CONCAT71(in_register_00000011,enc);
  if (bVar13 == 0xa5) {
    bVar13 = pExpr->pLeft->op;
    if ((bVar13 | 2) == 0x93) {
      pcVar16 = "-";
      lVar14 = -1;
      pExpr = pExpr->pLeft;
    }
    else {
      bVar13 = 0xa5;
    }
  }
  else if (bVar13 == 0x24) {
    uVar3 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
    iVar4 = valueFromExpr(db,pExpr->pLeft,enc,uVar3,ppVal,pCtx);
    if (*ppVal == (Mem *)0x0) {
      return iVar4;
    }
    sqlite3VdbeMemCast(*ppVal,uVar3,'\x01');
    applyAffinity(*ppVal,affinity,'\x01');
    return iVar4;
  }
  local_70 = ppVal;
  if (bVar13 < 0x92) {
    if (bVar13 != 0x6e) {
      if (bVar13 == 0x72) {
        local_98 = valueNew(db,pCtx);
        iVar4 = 0;
        if (local_98 == (sqlite3_value *)0x0) {
          local_98 = (sqlite3_value *)0x0;
          goto LAB_0016d7d8;
        }
        sqlite3VdbeMemNumerify(local_98);
        psVar8 = local_98;
        goto LAB_0016d9fe;
      }
      if (bVar13 == 0x91) goto LAB_0016d5be;
LAB_0016d47a:
      if ((pCtx == (ValueNewStat4Ctx *)0x0) || (bVar13 != 0xa1)) {
        iVar4 = 0;
        psVar8 = local_98;
        if ((bVar13 == 0x9f) && (psVar8 = valueNew(db,pCtx), psVar8 != (sqlite3_value *)0x0)) {
          psVar8->flags = 4;
          MVar12.i._1_7_ = 0;
          MVar12.i._0_1_ = (pExpr->u).zToken[4] == '\0';
          psVar8->u = MVar12;
        }
        goto LAB_0016d9fe;
      }
      pEVar2 = (pExpr->x).pList;
      iVar4 = 0;
      uVar15 = 0;
      if (pEVar2 != (ExprList *)0x0) {
        uVar15 = pEVar2->nExpr;
      }
      local_8c = (uint)enc;
      local_90 = uVar11;
      pFVar6 = sqlite3FindFunction(db,(pExpr->u).zToken,uVar15,enc,'\0');
      psVar8 = local_98;
      if ((char)((pFVar6->funcFlags & 0x20) >> 5) != '\0' || (pFVar6->funcFlags & 0x2800) == 0)
      goto LAB_0016d9fe;
      if (pEVar2 == (ExprList *)0x0) {
        p = (sqlite3_value **)0x0;
LAB_0016d8d3:
        psVar9 = valueNew(db,pCtx);
        if (psVar9 == (sqlite3_value *)0x0) {
          iVar4 = 7;
          psVar9 = (sqlite3_value *)0x0;
        }
        else {
          local_68.iOp = 0;
          local_68.isError = 0;
          local_68.skipFlag = '\0';
          local_68.argc = '\0';
          local_68._42_6_ = 0;
          local_68.pMem = (Mem *)0x0;
          local_68.pVdbe = (Vdbe *)0x0;
          local_68.argv[0] = (sqlite3_value *)0x0;
          local_68.pOut = psVar9;
          local_68.pFunc = pFVar6;
          (*pFVar6->xSFunc)(&local_68,uVar15,p);
          iVar4 = local_68.isError;
          if (local_68.isError == 0) {
            applyAffinity(psVar9,affinity,'\x01');
            iVar4 = 0;
            if (((psVar9->flags & 2) != 0) && (psVar9->enc != (u8)local_90)) {
              iVar4 = sqlite3VdbeMemTranslate(psVar9,(u8)local_8c);
            }
            if (iVar4 == 0) {
              iVar4 = 0;
              if ((psVar9->flags & 0x12) != 0) {
                iVar5 = psVar9->n;
                if ((psVar9->flags >> 0xe & 1) != 0) {
                  iVar5 = iVar5 + (psVar9->u).nZero;
                }
                if (psVar9->db->aLimit[0] < iVar5) {
                  piVar1 = &pCtx->pParse->nErr;
                  *piVar1 = *piVar1 + 1;
                  iVar4 = 0x12;
                }
              }
            }
          }
          else {
            pParse = pCtx->pParse;
            pvVar10 = sqlite3ValueText(psVar9,'\x01');
            sqlite3ErrorMsg(pParse,"%s",pvVar10);
          }
          pCtx->pParse->rc = iVar4;
        }
      }
      else {
        p = (sqlite3_value **)sqlite3DbMallocZero(db,(long)(int)uVar15 << 3);
        if (p != (sqlite3_value **)0x0) {
          if (0 < (int)uVar15) {
            lVar14 = 0;
            local_88 = pCtx;
            local_7c = (uint)affinity;
            local_78 = pFVar6;
            do {
              pExpr_00 = *(Expr **)((long)&pEVar2->a[0].pExpr + lVar14 * 4);
              iVar4 = 0;
              if (pExpr_00 != (Expr *)0x0) {
                iVar4 = valueFromExpr(db,pExpr_00,(u8)local_8c,(u8)local_7c,
                                      (sqlite3_value **)((long)p + lVar14),(ValueNewStat4Ctx *)0x0);
              }
              if ((*(sqlite3_value **)((long)p + lVar14) == (sqlite3_value *)0x0) || (iVar4 != 0))
              goto LAB_0016d9bf;
              lVar14 = lVar14 + 8;
              pFVar6 = local_78;
              pCtx = local_88;
            } while ((ulong)uVar15 << 3 != lVar14);
          }
          goto LAB_0016d8d3;
        }
        iVar4 = 7;
        p = (sqlite3_value **)0x0;
LAB_0016d9bf:
        psVar9 = (sqlite3_value *)0x0;
      }
      psVar8 = (sqlite3_value *)0x0;
      if (iVar4 == 0) {
        psVar8 = psVar9;
      }
      if (p != (sqlite3_value **)0x0) {
        if (0 < (int)uVar15) {
          uVar17 = 0;
          do {
            sqlite3ValueFree(p[uVar17]);
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        sqlite3DbFreeNN(db,p);
      }
      goto LAB_0016d9fe;
    }
  }
  else {
    if (bVar13 == 0x92) {
      local_88 = pCtx;
      psVar8 = valueNew(db,pCtx);
      iVar4 = 0;
      if (psVar8 != (sqlite3_value *)0x0) {
        pcVar16 = (pExpr->u).zToken;
        local_98 = psVar8;
        sVar7 = strlen(pcVar16 + 2);
        uVar15 = (uint)sVar7 & 0x3fffffff;
        iVar5 = uVar15 - 1;
        pcVar16 = (char *)sqlite3HexToBlob(db,pcVar16 + 2,iVar5);
        sqlite3VdbeMemSetStr
                  (psVar8,pcVar16,(int)((uVar15 - 1) - (iVar5 >> 0x1f)) >> 1,'\0',sqlite3MallocSize)
        ;
        psVar8 = local_98;
        goto LAB_0016d9fe;
      }
      pCtx = local_88;
      local_98 = (sqlite3_value *)0x0;
      goto LAB_0016d7d8;
    }
    if (bVar13 == 0xa5) {
      iVar5 = valueFromExpr(db,pExpr->pLeft,enc,affinity,&local_98,pCtx);
      psVar8 = local_98;
      iVar4 = 0;
      if (local_98 != (Mem *)0x0 && iVar5 == 0) {
        sqlite3VdbeMemNumerify(local_98);
        if ((psVar8->flags & 8) == 0) {
          (psVar8->u).i = -(psVar8->u).i;
        }
        else {
          (psVar8->u).i = (psVar8->u).i ^ 0x8000000000000000;
        }
        applyAffinity(psVar8,affinity,enc);
        psVar8 = local_98;
      }
      goto LAB_0016d9fe;
    }
    if (bVar13 != 0x93) goto LAB_0016d47a;
  }
LAB_0016d5be:
  local_90 = uVar11;
  psVar9 = valueNew(db,pCtx);
  local_98 = psVar9;
  if (psVar9 != (sqlite3_value *)0x0) {
    if ((pExpr->flags & 0x400) == 0) {
      pcVar16 = sqlite3MPrintf(db,"%s%s",pcVar16,(pExpr->u).zToken);
      if (pcVar16 == (char *)0x0) goto LAB_0016d7d8;
      sqlite3VdbeMemSetStr(psVar9,pcVar16,-1,'\x01',sqlite3MallocSize);
    }
    else {
      lVar14 = lVar14 * (pExpr->u).iValue;
      if ((psVar9->flags & 0x2400) == 0) {
        (psVar9->u).i = lVar14;
        psVar9->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(psVar9,lVar14);
      }
    }
    uVar3 = 'C';
    if (affinity != 'A' || (bVar13 & 0xfd) != 0x91) {
      uVar3 = affinity;
    }
    applyAffinity(psVar9,uVar3,'\x01');
    if ((psVar9->flags & 0xc) != 0) {
      psVar9->flags = psVar9->flags & 0xfffd;
    }
    iVar4 = 0;
    uVar3 = (u8)local_90;
    psVar8 = local_98;
    if (((uVar3 != '\x01') && ((psVar9->flags & 2) != 0)) && (psVar9->enc != uVar3)) {
      iVar4 = sqlite3VdbeMemTranslate(psVar9,uVar3);
      psVar8 = local_98;
    }
LAB_0016d9fe:
    local_98 = psVar8;
    *local_70 = local_98;
    return iVar4;
  }
LAB_0016d7d8:
  if ((pCtx == (ValueNewStat4Ctx *)0x0) || (pCtx->pParse->nErr == 0)) {
    sqlite3OomFault(db);
  }
  if (pCtx != (ValueNewStat4Ctx *)0x0) {
    return 7;
  }
  sqlite3ValueFree(local_98);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  Expr *pExpr,                    /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
#if defined(SQLITE_ENABLE_STAT3_OR_STAT4)
  if( op==TK_REGISTER ) op = pExpr->op2;
#else
  if( NEVER(op==TK_REGISTER) ) op = pExpr->op2;
#endif

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, SQLITE_UTF8);
      sqlite3ValueApplyAffinity(*ppVal, affinity, SQLITE_UTF8);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    if( pVal->flags & (MEM_Int|MEM_Real) ) pVal->flags &= ~MEM_Str;
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx) 
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
        pVal->u.r = -(double)SMALLEST_INT64;
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemNumerify(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 || pCtx->pParse->nErr==0 )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}